

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O3

float core::image::desaturate_lightness<float>(float *v)

{
  float fVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  fVar1 = *v;
  fVar2 = v[1];
  fVar5 = fVar2;
  if (fVar1 <= fVar2) {
    fVar5 = fVar1;
  }
  lVar4 = (ulong)(fVar2 < fVar1) << 2;
  if (v[2] < fVar5) {
    lVar4 = 8;
  }
  fVar5 = fVar2;
  if (fVar2 <= fVar1) {
    fVar5 = fVar1;
  }
  lVar3 = (ulong)(fVar1 < fVar2) << 2;
  if (fVar5 < v[2]) {
    lVar3 = 8;
  }
  return *(float *)((long)v + lVar3) * 0.5 + *(float *)((long)v + lVar4) * 0.5;
}

Assistant:

inline T
desaturate_lightness (T const* v)
{
    T const* max = std::max_element(v, v + 3);
    T const* min = std::min_element(v, v + 3);
    return math::interpolate(*max, *min, 0.5f, 0.5f);
}